

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns,xmlC14NCtxPtr ctx)

{
  xmlNsPtr *ppxVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  xmlChar *str1;
  _xmlNode *str2;
  xmlChar *pxVar6;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam(ctx);
    iVar4 = 0;
  }
  else {
    if (ns == (xmlNsPtr)0x0) {
      pxVar6 = "";
      str1 = "";
    }
    else {
      pxVar6 = ns->prefix;
      if (pxVar6 == (xmlChar *)0x0) {
        pxVar6 = "";
      }
      str1 = ns->href;
      if (str1 == (xmlChar *)0x0) {
        str1 = "";
      }
    }
    iVar4 = 0;
    iVar3 = xmlC14NStrEqual(pxVar6,(xmlChar *)0x0);
    if (iVar3 != 0) {
      iVar4 = xmlC14NStrEqual(str1,(xmlChar *)0x0);
    }
    ppxVar1 = cur->nsTab;
    if (ppxVar1 != (xmlNsPtr *)0x0) {
      uVar5 = (ulong)(uint)cur->nsCurEnd;
      do {
        if ((int)uVar5 < 1) {
          return iVar4;
        }
        pxVar2 = (xmlNodePtr)ppxVar1[uVar5 - 1];
        if (pxVar2 == (xmlNodePtr)0x0) {
          str2 = (_xmlNode *)0x0;
        }
        else {
          str2 = pxVar2->children;
        }
        iVar3 = xmlC14NStrEqual(pxVar6,(xmlChar *)str2);
        uVar5 = uVar5 - 1;
      } while (iVar3 == 0);
      iVar4 = 0;
      if (pxVar2 == (xmlNodePtr)0x0) {
        pxVar6 = (xmlChar *)0x0;
      }
      else {
        pxVar6 = pxVar2->name;
      }
      iVar3 = xmlC14NStrEqual(str1,pxVar6);
      if (iVar3 != 0) {
        if (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0) {
          iVar4 = (*ctx->is_visible_callback)(ctx->user_data,pxVar2,cur->nodeTab[uVar5]);
          return iVar4;
        }
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns, xmlC14NCtxPtr ctx) {
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam(ctx);
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = 0;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		if(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL)) {
		    return(xmlC14NIsVisible(ctx, ns1, cur->nodeTab[i]));
		} else {
		    return(0);
		}
	    }
        }
    }
    return(has_empty_ns);
}